

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::OutputFile::Data::~Data(Data *this)

{
  pointer ppLVar1;
  LineBuffer *this_00;
  long *plVar2;
  size_t i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppLVar1 = (this->lineBuffers).
              super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->lineBuffers).
                      super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3) <= uVar3)
    break;
    this_00 = ppLVar1[uVar3];
    if (this_00 != (LineBuffer *)0x0) {
      plVar2 = (long *)(this_00->sampleCountTableBuffer)._size;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      IlmThread_3_4::Semaphore::~Semaphore((Semaphore *)&this_00->scanLineMin);
      std::__cxx11::string::~string((string *)&this_00->sampleCountTablePtr);
      Array<char>::~Array((Array<char> *)this_00);
    }
    operator_delete(this_00,0x90);
    uVar3 = uVar3 + 1;
  }
  std::
  vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ::~vector(&this->lineBuffers);
  std::
  vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
  ::~vector(&this->slices);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->offsetInLineBuffer).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

OutputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size (); i++)
        delete lineBuffers[i];
}